

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

void __thiscall Liby::Channel::~Channel(Channel *this)

{
  removeChannel(this);
  std::_Function_base::~_Function_base(&(this->erroEventCallback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->writEventCallback_).super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

Channel::~Channel() { removeChannel(); }